

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

void secp256k1_schnorrsig_challenge
               (secp256k1_scalar *e,uchar *r32,uchar *msg,size_t msglen,uchar *pubkey32)

{
  secp256k1_sha256 sha;
  uchar buf [32];
  int *in_stack_ffffffffffffff50;
  uchar *in_stack_ffffffffffffff58;
  secp256k1_sha256 *in_stack_ffffffffffffff60;
  
  secp256k1_schnorrsig_sha256_tagged((secp256k1_sha256 *)0x15601f9);
  secp256k1_sha256_write
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,(size_t)in_stack_ffffffffffffff50);
  secp256k1_sha256_write
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,(size_t)in_stack_ffffffffffffff50);
  secp256k1_sha256_write
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,(size_t)in_stack_ffffffffffffff50);
  secp256k1_sha256_finalize(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  secp256k1_scalar_set_b32
            ((secp256k1_scalar *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
             in_stack_ffffffffffffff50);
  return;
}

Assistant:

static void secp256k1_schnorrsig_challenge(secp256k1_scalar* e, const unsigned char *r32, const unsigned char *msg, size_t msglen, const unsigned char *pubkey32)
{
    unsigned char buf[32];
    secp256k1_sha256 sha;

    /* tagged hash(r.x, pk.x, msg) */
    secp256k1_schnorrsig_sha256_tagged(&sha);
    secp256k1_sha256_write(&sha, r32, 32);
    secp256k1_sha256_write(&sha, pubkey32, 32);
    secp256k1_sha256_write(&sha, msg, msglen);
    secp256k1_sha256_finalize(&sha, buf);
    /* Set scalar e to the challenge hash modulo the curve order as per
     * BIP340. */
    secp256k1_scalar_set_b32(e, buf, NULL);
}